

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O3

void __thiscall
TrodesMsg::appendArg
          (TrodesMsg *this,char c,vector<unsigned_char,_std::allocator<unsigned_char>_> *a)

{
  pointer data;
  string *psVar1;
  
  if (c == 'b') {
    data = (a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
    zmsg_addmem(this->msg,data,
                (long)(a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)data);
    return;
  }
  psVar1 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar1,"Could not append to msg. Expected a different type, got byte vector","");
  __cxa_throw(psVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void TrodesMsg::appendArg (const char c, const std::vector<byte> &a){
    if(c != 'b') throw std::string(APPENDERROR "byte vector");
    zmsg_addmem(msg, a.data(), a.size());
}